

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR eval_function_call(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options)

{
  long *plVar1;
  uint32_t uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  long *__ptr;
  long *plVar8;
  lyxp_set *plVar9;
  code *pcVar10;
  long lVar11;
  code *pcVar12;
  LY_ERR LVar13;
  undefined4 uVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  
  if ((options & 0x20) != 0) {
    pcVar15 = "skipped";
    pcVar12 = (code *)0x0;
    goto LAB_001b1108;
  }
  uVar5 = *tok_idx;
  uVar17 = exp->tok_len[uVar5];
  bVar3 = true;
  pcVar12 = (code *)0x0;
  switch(uVar17) {
  case 3:
    uVar6 = exp->tok_pos[uVar5];
    pcVar15 = exp->expr;
    iVar4 = strncmp(pcVar15 + uVar6,"not",3);
    if (iVar4 == 0) {
      pcVar12 = xpath_not;
      goto LAB_001b10bf;
    }
    iVar4 = strncmp(pcVar15 + uVar6,"sum",3);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_sum;
    break;
  case 4:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"lang",4);
    if (iVar4 == 0) {
      pcVar12 = xpath_lang;
    }
    else {
      iVar4 = strncmp(pcVar15,"last",4);
      if (iVar4 == 0) {
        pcVar12 = xpath_last;
      }
      else {
        iVar4 = strncmp(pcVar15,"name",4);
        if (iVar4 != 0) {
          iVar4 = strncmp(pcVar15,"true",4);
          bVar19 = iVar4 == 0;
          bVar3 = !bVar19;
          pcVar10 = xpath_true;
          break;
        }
        pcVar12 = xpath_name;
      }
    }
    goto LAB_001b10bf;
  case 5:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"count",5);
    if (iVar4 == 0) {
      pcVar12 = xpath_count;
    }
    else {
      iVar4 = strncmp(pcVar15,"false",5);
      if (iVar4 == 0) {
        pcVar12 = xpath_false;
      }
      else {
        iVar4 = strncmp(pcVar15,"floor",5);
        if (iVar4 == 0) {
          pcVar12 = xpath_floor;
        }
        else {
          iVar4 = strncmp(pcVar15,"round",5);
          if (iVar4 != 0) {
            iVar4 = strncmp(pcVar15,"deref",5);
            bVar19 = iVar4 == 0;
            bVar3 = !bVar19;
            pcVar10 = xpath_deref;
            break;
          }
          pcVar12 = xpath_round;
        }
      }
    }
    goto LAB_001b10bf;
  case 6:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"concat",6);
    if (iVar4 == 0) {
      pcVar12 = xpath_concat;
    }
    else {
      iVar4 = strncmp(pcVar15,"number",6);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar15,"string",6);
        bVar19 = iVar4 == 0;
        bVar3 = !bVar19;
        pcVar10 = xpath_string;
        break;
      }
      pcVar12 = xpath_number;
    }
    goto LAB_001b10bf;
  case 7:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"boolean",7);
    if (iVar4 == 0) {
      pcVar12 = xpath_boolean;
    }
    else {
      iVar4 = strncmp(pcVar15,"ceiling",7);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar15,"current",7);
        bVar19 = iVar4 == 0;
        bVar3 = !bVar19;
        pcVar10 = xpath_current;
        break;
      }
      pcVar12 = xpath_ceiling;
    }
    goto LAB_001b10bf;
  case 8:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"contains",8);
    if (iVar4 == 0) {
      pcVar12 = xpath_contains;
    }
    else {
      iVar4 = strncmp(pcVar15,"position",8);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar15,"re-match",8);
        bVar19 = iVar4 == 0;
        bVar3 = !bVar19;
        pcVar10 = xpath_re_match;
        break;
      }
      pcVar12 = xpath_position;
    }
    goto LAB_001b10bf;
  case 9:
    uVar6 = exp->tok_pos[uVar5];
    pcVar15 = exp->expr;
    iVar4 = strncmp(pcVar15 + uVar6,"substring",9);
    if (iVar4 == 0) {
      pcVar12 = xpath_substring;
      goto LAB_001b10bf;
    }
    iVar4 = strncmp(pcVar15 + uVar6,"translate",9);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_translate;
    break;
  case 10:
    pcVar15 = exp->expr + exp->tok_pos[uVar5];
    iVar4 = strncmp(pcVar15,"local-name",10);
    if (iVar4 == 0) {
      pcVar12 = xpath_local_name;
    }
    else {
      iVar4 = strncmp(pcVar15,"enum-value",10);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar15,"bit-is-set",10);
        bVar19 = iVar4 == 0;
        bVar3 = !bVar19;
        pcVar10 = xpath_bit_is_set;
        break;
      }
      pcVar12 = xpath_enum_value;
    }
LAB_001b10bf:
    bVar3 = false;
    goto switchD_001b0b25_caseD_e;
  case 0xb:
    iVar4 = strncmp(exp->expr + exp->tok_pos[uVar5],"starts-with",0xb);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_starts_with;
    break;
  case 0xc:
    iVar4 = strncmp(exp->expr + exp->tok_pos[uVar5],"derived-from",0xc);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_derived_from;
    break;
  case 0xd:
    uVar6 = exp->tok_pos[uVar5];
    pcVar15 = exp->expr;
    iVar4 = strncmp(pcVar15 + uVar6,"namespace-uri",0xd);
    if (iVar4 == 0) {
      pcVar12 = xpath_namespace_uri;
      goto LAB_001b10bf;
    }
    iVar4 = strncmp(pcVar15 + uVar6,"string-length",0xd);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_string_length;
    break;
  default:
    goto switchD_001b0b25_caseD_e;
  case 0xf:
    uVar6 = exp->tok_pos[uVar5];
    pcVar15 = exp->expr;
    iVar4 = strncmp(pcVar15 + uVar6,"normalize-space",0xf);
    if (iVar4 == 0) {
      pcVar12 = xpath_normalize_space;
      goto LAB_001b10bf;
    }
    iVar4 = strncmp(pcVar15 + uVar6,"substring-after",0xf);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_substring_after;
    break;
  case 0x10:
    iVar4 = strncmp(exp->expr + exp->tok_pos[uVar5],"substring-before",0x10);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_substring_before;
    break;
  case 0x14:
    iVar4 = strncmp(exp->expr + exp->tok_pos[uVar5],"derived-from-or-self",0x14);
    bVar19 = iVar4 == 0;
    bVar3 = !bVar19;
    pcVar10 = xpath_derived_from_or_self;
  }
  pcVar12 = (code *)0x0;
  if (bVar19) {
    pcVar12 = pcVar10;
  }
switchD_001b0b25_caseD_e:
  if (bVar3) {
    ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Unknown XPath function \"%.*s\".",(ulong)uVar17,
            exp->expr + exp->tok_pos[uVar5]);
    return LY_EVALID;
  }
  pcVar15 = "parsed";
LAB_001b1108:
  pcVar7 = lyxp_token2str(exp->tokens[*tok_idx]);
  uVar16 = 0;
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar15,pcVar7,(ulong)exp->tok_pos[*tok_idx]);
  uVar5 = *tok_idx + 1;
  *tok_idx = uVar5;
  if (exp->tokens[uVar5] != LYXP_TOKEN_PAR1) {
    __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x21fe,
                  "LY_ERR eval_function_call(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t)"
                 );
  }
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar15,"(",(ulong)exp->tok_pos[uVar5]);
  uVar2 = *tok_idx;
  *tok_idx = uVar2 + 1;
  if (exp->tokens[uVar2 + 1] == LYXP_TOKEN_PAR2) {
    __ptr = (long *)0x0;
  }
  else if ((options & 0x20) == 0) {
    __ptr = (long *)malloc(8);
    if (__ptr == (long *)0x0) {
      uVar17 = 0;
      __ptr = (long *)0x0;
LAB_001b1230:
      LVar13 = LY_EMEM;
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","eval_function_call");
      plVar8 = __ptr;
      uVar5 = uVar17;
      goto LAB_001b1489;
    }
    plVar9 = set_copy(set);
    *__ptr = (long)plVar9;
    plVar8 = __ptr;
    uVar5 = 1;
    if (plVar9 == (lyxp_set *)0x0) {
      LVar13 = LY_EMEM;
      goto LAB_001b1489;
    }
    LVar13 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,plVar9,options);
    if (LVar13 != LY_SUCCESS) goto LAB_001b1489;
    set->not_found = *(ly_bool *)(*__ptr + 0x39);
    uVar16 = 1;
  }
  else {
    LVar13 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
    if (LVar13 != LY_SUCCESS) {
      plVar8 = (long *)0x0;
      uVar5 = 0;
      goto LAB_001b1489;
    }
    uVar16 = 0;
    __ptr = (long *)0x0;
  }
  uVar6 = *tok_idx;
  plVar8 = __ptr;
  if (exp->used != uVar6) {
    do {
      uVar17 = (uint)uVar16;
      plVar8 = __ptr;
      if (exp->tokens[uVar6] != LYXP_TOKEN_COMMA) break;
      pcVar7 = lyxp_token2str(exp->tokens[uVar6]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar15,pcVar7,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      if ((options & 0x20) == 0) {
        uVar5 = uVar17 + 1;
        uVar18 = (ulong)uVar5;
        plVar8 = (long *)realloc(__ptr,uVar18 * 8);
        if (plVar8 == (long *)0x0) goto LAB_001b1230;
        plVar9 = set_copy(set);
        plVar8[uVar16] = (long)plVar9;
        if (plVar9 == (lyxp_set *)0x0) {
          LVar13 = LY_EMEM;
          goto LAB_001b1489;
        }
        LVar13 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,plVar9,options);
        if (LVar13 != LY_SUCCESS) goto LAB_001b1489;
        plVar1 = plVar8 + uVar16;
        uVar16 = uVar18;
        __ptr = plVar8;
        if (*(char *)(*plVar1 + 0x39) != '\0') {
          set->not_found = '\x01';
        }
      }
      else {
        LVar13 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
        uVar5 = uVar17;
        if (LVar13 != LY_SUCCESS) goto LAB_001b1489;
      }
      uVar6 = *tok_idx;
      plVar8 = __ptr;
    } while (exp->used != uVar6);
  }
  uVar5 = (uint)uVar16;
  if (exp->tokens[uVar6] != LYXP_TOKEN_PAR2) {
    __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x2233,
                  "LY_ERR eval_function_call(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t)"
                 );
  }
  LVar13 = LY_SUCCESS;
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_function_call",pcVar15,")",(ulong)exp->tok_pos[uVar6]);
  *tok_idx = *tok_idx + 1;
  if (((options & 0x20) == 0) &&
     (LVar13 = (*pcVar12)(plVar8,uVar16,set,options), uVar5 != 0 && (options & 0x1c) != 0)) {
    uVar18 = 0;
    do {
      plVar9 = (lyxp_set *)plVar8[uVar18];
      uVar17 = plVar9->used;
      if ((ulong)uVar17 != 0) {
        lVar11 = 0;
        do {
          iVar4 = *(int *)((long)&((plVar9->val).nodes)->pos + lVar11);
          if (iVar4 == 2) {
            uVar14 = 0;
LAB_001b135c:
            *(undefined4 *)((long)&((plVar9->val).nodes)->pos + lVar11) = uVar14;
          }
          else if (iVar4 == -2) {
            uVar14 = 0xffffffff;
            goto LAB_001b135c;
          }
          lVar11 = lVar11 + 0x18;
        } while ((ulong)uVar17 * 0x18 != lVar11);
      }
      lyxp_set_scnode_merge(set,plVar9);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar16);
  }
LAB_001b1489:
  if (uVar5 != 0) {
    uVar16 = 0;
    do {
      plVar9 = (lyxp_set *)plVar8[uVar16];
      if (plVar9 != (lyxp_set *)0x0) {
        lyxp_set_free_content(plVar9);
        free(plVar9);
      }
      uVar16 = uVar16 + 1;
    } while (uVar5 != uVar16);
  }
  free(plVar8);
  return LVar13;
}

Assistant:

static LY_ERR
eval_function_call(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options)
{
    LY_ERR rc;

    LY_ERR (*xpath_func)(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t) = NULL;
    uint32_t arg_count = 0, i;
    struct lyxp_set **args = NULL, **args_aux;

    if (!(options & LYXP_SKIP_EXPR)) {
        /* FunctionName */
        switch (exp->tok_len[*tok_idx]) {
        case 3:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "not", 3)) {
                xpath_func = &xpath_not;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "sum", 3)) {
                xpath_func = &xpath_sum;
            }
            break;
        case 4:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "lang", 4)) {
                xpath_func = &xpath_lang;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "last", 4)) {
                xpath_func = &xpath_last;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "name", 4)) {
                xpath_func = &xpath_name;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "true", 4)) {
                xpath_func = &xpath_true;
            }
            break;
        case 5:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "count", 5)) {
                xpath_func = &xpath_count;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "false", 5)) {
                xpath_func = &xpath_false;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "floor", 5)) {
                xpath_func = &xpath_floor;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "round", 5)) {
                xpath_func = &xpath_round;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "deref", 5)) {
                xpath_func = &xpath_deref;
            }
            break;
        case 6:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "concat", 6)) {
                xpath_func = &xpath_concat;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "number", 6)) {
                xpath_func = &xpath_number;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "string", 6)) {
                xpath_func = &xpath_string;
            }
            break;
        case 7:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "boolean", 7)) {
                xpath_func = &xpath_boolean;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "ceiling", 7)) {
                xpath_func = &xpath_ceiling;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "current", 7)) {
                xpath_func = &xpath_current;
            }
            break;
        case 8:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "contains", 8)) {
                xpath_func = &xpath_contains;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "position", 8)) {
                xpath_func = &xpath_position;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "re-match", 8)) {
                xpath_func = &xpath_re_match;
            }
            break;
        case 9:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring", 9)) {
                xpath_func = &xpath_substring;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "translate", 9)) {
                xpath_func = &xpath_translate;
            }
            break;
        case 10:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "local-name", 10)) {
                xpath_func = &xpath_local_name;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "enum-value", 10)) {
                xpath_func = &xpath_enum_value;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "bit-is-set", 10)) {
                xpath_func = &xpath_bit_is_set;
            }
            break;
        case 11:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "starts-with", 11)) {
                xpath_func = &xpath_starts_with;
            }
            break;
        case 12:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "derived-from", 12)) {
                xpath_func = &xpath_derived_from;
            }
            break;
        case 13:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "namespace-uri", 13)) {
                xpath_func = &xpath_namespace_uri;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "string-length", 13)) {
                xpath_func = &xpath_string_length;
            }
            break;
        case 15:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "normalize-space", 15)) {
                xpath_func = &xpath_normalize_space;
            } else if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring-after", 15)) {
                xpath_func = &xpath_substring_after;
            }
            break;
        case 16:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "substring-before", 16)) {
                xpath_func = &xpath_substring_before;
            }
            break;
        case 20:
            if (!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], "derived-from-or-self", 20)) {
                xpath_func = &xpath_derived_from_or_self;
            }
            break;
        }

        if (!xpath_func) {
            LOGVAL(set->ctx, LY_VCODE_XP_INFUNC, (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]]);
            return LY_EVALID;
        }
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    /* '(' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    /* ( Expr ( ',' Expr )* )? */
    if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR2) {
        if (!(options & LYXP_SKIP_EXPR)) {
            args = malloc(sizeof *args);
            LY_CHECK_ERR_GOTO(!args, LOGMEM(set->ctx); rc = LY_EMEM, cleanup);
            arg_count = 1;
            args[0] = set_copy(set);
            if (!args[0]) {
                rc = LY_EMEM;
                goto cleanup;
            }

            rc = eval_expr_select(exp, tok_idx, 0, args[0], options);
            LY_CHECK_GOTO(rc, cleanup);
            set->not_found = args[0]->not_found;
        } else {
            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            LY_CHECK_GOTO(rc, cleanup);
        }
    }
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_COMMA)) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        if (!(options & LYXP_SKIP_EXPR)) {
            ++arg_count;
            args_aux = realloc(args, arg_count * sizeof *args);
            LY_CHECK_ERR_GOTO(!args_aux, arg_count--; LOGMEM(set->ctx); rc = LY_EMEM, cleanup);
            args = args_aux;
            args[arg_count - 1] = set_copy(set);
            if (!args[arg_count - 1]) {
                rc = LY_EMEM;
                goto cleanup;
            }

            rc = eval_expr_select(exp, tok_idx, 0, args[arg_count - 1], options);
            LY_CHECK_GOTO(rc, cleanup);
            if (args[arg_count - 1]->not_found) {
                set->not_found = 1;
            }
        } else {
            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            LY_CHECK_GOTO(rc, cleanup);
        }
    }

    /* ')' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    if (!(options & LYXP_SKIP_EXPR)) {
        /* evaluate function */
        rc = xpath_func(args, arg_count, set, options);

        if (options & LYXP_SCNODE_ALL) {
            /* merge all nodes from arg evaluations */
            for (i = 0; i < arg_count; ++i) {
                set_scnode_clear_ctx(args[i], LYXP_SET_SCNODE_ATOM_NODE);
                lyxp_set_scnode_merge(set, args[i]);
            }
        }
    } else {
        rc = LY_SUCCESS;
    }

cleanup:
    for (i = 0; i < arg_count; ++i) {
        lyxp_set_free(args[i]);
    }
    free(args);
    return rc;
}